

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.h
# Opt level: O1

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,StringRef Str)

{
  raw_ostream *prVar1;
  size_t in_RCX;
  char *__buf;
  
  __buf = (char *)Str.Length;
  if (this->OutBufEnd + -(long)this->OutBufCur < __buf) {
    prVar1 = (raw_ostream *)write(this,(int)Str.Data,__buf,in_RCX);
    return prVar1;
  }
  if (__buf != (char *)0x0) {
    memcpy(this->OutBufCur,Str.Data,(size_t)__buf);
    this->OutBufCur = this->OutBufCur + (long)__buf;
  }
  return this;
}

Assistant:

raw_ostream &operator<<(StringRef Str) {
    // Inline fast path, particularly for strings with a known length.
    size_t Size = Str.size();

    // Make sure we can use the fast path.
    if (Size > (size_t)(OutBufEnd - OutBufCur))
      return write(Str.data(), Size);

    if (Size) {
      memcpy(OutBufCur, Str.data(), Size);
      OutBufCur += Size;
    }
    return *this;
  }